

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::TextureCubeArraySpecCase::TextureCubeArraySpecCase
          (TextureCubeArraySpecCase *this,Context *context,char *name,char *desc,
          TextureFormat *format,int size,int depth,int numLevels)

{
  int size_local;
  TextureFormat *format_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  TextureCubeArraySpecCase *this_local;
  
  TextureSpecCase::TextureSpecCase(&this->super_TextureSpecCase,context,name,desc);
  (this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureCubeArraySpecCase_011c5c80;
  this->m_texFormat = *format;
  tcu::getTextureFormatInfo(&this->m_texFormatInfo,format);
  this->m_size = size;
  this->m_depth = depth;
  this->m_numLevels = numLevels;
  return;
}

Assistant:

TextureCubeArraySpecCase::TextureCubeArraySpecCase (Context& context, const char* name, const char* desc, const tcu::TextureFormat& format, int size, int depth, int numLevels)
	: TextureSpecCase		(context, name, desc)
	, m_texFormat			(format)
	, m_texFormatInfo		(tcu::getTextureFormatInfo(format))
	, m_size				(size)
	, m_depth				(depth)
	, m_numLevels			(numLevels)
{
}